

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

Real __thiscall
amrex::MLMG::solve(MLMG *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_sol,
                  Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_rhs,Real a_tol_rel,
                  Real a_tol_abs,char *checkpoint_file)

{
  ostringstream *poVar1;
  Real *x;
  pointer *pppMVar2;
  MLLinOp *pMVar3;
  pointer piVar4;
  pointer pdVar5;
  bool bVar6;
  BottomSolver BVar7;
  MultiFab *pMVar8;
  ostream *poVar9;
  double *pdVar10;
  Print *pPVar11;
  ulong uVar12;
  int alev;
  int lev;
  int iter;
  long lVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  Real RVar19;
  double dVar20;
  double dVar21;
  Real RVar22;
  initializer_list<std::reference_wrapper<double>_> __l;
  Real fine_norminf;
  uint local_248;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_240;
  Real local_238;
  Real resnorm0;
  Real rhsnorm0;
  string norm_name;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> mf_sol;
  undefined8 auStack_1b0 [45];
  _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
  local_48;
  
  local_240 = a_sol;
  local_238 = a_tol_abs;
  if (checkpoint_file != (char *)0x0) {
    bVar6 = Any::is<amrex::MultiFab>
                      ((a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (bVar6) {
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                (&mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
                 (long)this->namrlevs,(allocator_type *)&norm_name);
      std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
                ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &norm_name,(long)this->namrlevs,(allocator_type *)&fine_norminf);
      lVar14 = 0;
      for (lVar13 = 0; lVar13 < this->namrlevs; lVar13 = lVar13 + 1) {
        pMVar8 = Any::get<amrex::MultiFab>
                           ((Any *)((long)&(((local_240->
                                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t
                                           .
                                           super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                           .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                           ._M_head_impl + lVar14));
        *(MultiFab **)
         ((long)mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start + lVar14) = pMVar8;
        pMVar8 = Any::get<amrex::MultiFab>
                           ((Any *)((long)&(((a_rhs->
                                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t
                                           .
                                           super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                           .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                           ._M_head_impl + lVar14));
        *(MultiFab **)(norm_name._M_dataplus._M_p + lVar14) = pMVar8;
        lVar14 = lVar14 + 8;
      }
      checkPoint(this,&mf_sol,
                 (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 &norm_name,a_tol_rel,local_238,checkpoint_file);
      std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
      ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                     *)&norm_name);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mf_sol);
    }
    else {
      Abort_host("MLMG::solve: checkpoint not supported for non-MultiFab type");
    }
  }
  if (this->bottom_solver == Default) {
    BVar7 = (*this->linop->_vptr_MLLinOp[4])();
    this->bottom_solver = BVar7;
  }
  pMVar3 = this->linop->m_parent;
  dVar17 = second();
  piVar4 = (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar4) {
    (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar4
    ;
  }
  pdVar5 = (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar5) {
    (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar5;
  }
  prepareForSolve(this,local_240,a_rhs);
  computeMLResidual(this,this->finest_amr_lev);
  resnorm0 = MLResNormInf(this,this->finest_amr_lev,false);
  rhsnorm0 = MLRhsNormInf(this,false);
  if (pMVar3 == (MLLinOp *)0x0) {
    mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&resnorm0;
    mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&rhsnorm0;
    __l._M_len = 2;
    __l._M_array = (iterator)&mf_sol;
    std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
    vector((vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
            *)&local_48,__l,(allocator_type *)&norm_name);
    std::
    _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
    ~_Vector_base(&local_48);
    if (0 < this->verbose) {
      poVar9 = OutStream();
      Print::Print((Print *)&mf_sol,poVar9);
      pppMVar2 = &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      std::operator<<((ostream *)pppMVar2,"MLMG: Initial rhs               = ");
      std::ostream::_M_insert<double>(rhsnorm0);
      std::operator<<((ostream *)pppMVar2,"\n");
      std::operator<<((ostream *)pppMVar2,"MLMG: Initial residual (resid0) = ");
      std::ostream::_M_insert<double>(resnorm0);
      std::operator<<((ostream *)pppMVar2,"\n");
      Print::~Print((Print *)&mf_sol);
    }
  }
  this->m_init_resnorm0 = resnorm0;
  this->m_rhsnorm0 = rhsnorm0;
  norm_name._M_dataplus._M_p = (pointer)&norm_name.field_2;
  norm_name._M_string_length = 0;
  norm_name.field_2._M_local_buf[0] = '\0';
  if ((this->always_use_bnorm != 0) || (resnorm0 <= rhsnorm0)) {
    std::__cxx11::string::assign((char *)&norm_name);
    pdVar10 = &rhsnorm0;
  }
  else {
    std::__cxx11::string::assign((char *)&norm_name);
    pdVar10 = &resnorm0;
  }
  dVar20 = *pdVar10;
  dVar18 = 1e-16;
  if (1e-16 <= a_tol_rel) {
    dVar18 = a_tol_rel;
  }
  dVar21 = dVar18 * dVar20;
  if (dVar18 * dVar20 <= local_238) {
    dVar21 = local_238;
  }
  if ((pMVar3 != (MLLinOp *)0x0) || (dVar21 < resnorm0)) {
    local_238 = dVar21;
    dVar18 = second();
    iVar15 = this->do_fixed_number_of_iters;
    if (iVar15 == 0) {
      iVar15 = this->max_iters;
    }
    x = &this->m_final_resnorm0;
    iter = 0;
    if (iVar15 < 1) {
      iVar15 = 0;
      iter = 0;
    }
    for (; iVar15 != iter; iter = iter + 1) {
      oneIter(this,iter);
      computeResidual(this,this->finest_amr_lev);
      if (pMVar3 == (MLLinOp *)0x0) {
        fine_norminf = ResNormInf(this,this->finest_amr_lev,false);
        std::vector<double,_std::allocator<double>_>::push_back
                  (&(this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>,
                   &fine_norminf);
        this->m_final_resnorm0 = fine_norminf;
        if (1 < this->verbose) {
          poVar9 = OutStream();
          Print::Print((Print *)&mf_sol,poVar9);
          pppMVar2 = &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::operator<<((ostream *)pppMVar2,"MLMG: Iteration ");
          *(undefined8 *)
           ((long)auStack_1b0 +
           (long)mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[-3]) = 3;
          std::ostream::operator<<(pppMVar2,iter + 1);
          std::operator<<((ostream *)pppMVar2," Fine resid/");
          std::operator<<((ostream *)pppMVar2,(string *)&norm_name);
          std::operator<<((ostream *)pppMVar2," = ");
          std::ostream::_M_insert<double>(fine_norminf / dVar20);
          std::operator<<((ostream *)pppMVar2,"\n");
          Print::~Print((Print *)&mf_sol);
        }
        bVar6 = local_238 < fine_norminf;
        bVar16 = this->namrlevs != 1;
        if ((bVar16 || bVar6) && !bVar6) {
          computeMLResidual(this,this->finest_amr_lev + -1);
          RVar19 = MLResNormInf(this,this->finest_amr_lev + -1,false);
          if (1 < this->verbose) {
            poVar9 = OutStream();
            Print::Print((Print *)&mf_sol,poVar9);
            pppMVar2 = &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
            std::operator<<((ostream *)pppMVar2,"MLMG: Iteration ");
            *(undefined8 *)
             ((long)auStack_1b0 +
             (long)mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage[-3]) = 3;
            std::ostream::operator<<(pppMVar2,iter + 1);
            std::operator<<((ostream *)pppMVar2," Crse resid/");
            std::operator<<((ostream *)pppMVar2,(string *)&norm_name);
            std::operator<<((ostream *)pppMVar2," = ");
            std::ostream::_M_insert<double>(RVar19 / dVar20);
            std::operator<<((ostream *)pppMVar2,"\n");
            Print::~Print((Print *)&mf_sol);
          }
          RVar22 = RVar19;
          if (RVar19 <= fine_norminf) {
            RVar22 = fine_norminf;
          }
          *x = RVar22;
          if (local_238 < RVar19) goto LAB_004e22a4;
        }
        else if (bVar16 || bVar6) {
LAB_004e22a4:
          if (dVar20 * 1e+20 < *x) {
            if (0 < this->verbose) {
              poVar9 = OutStream();
              Print::Print((Print *)&mf_sol,poVar9);
              pppMVar2 = &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                          .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::operator<<((ostream *)pppMVar2,"MLMG: Failing to converge after ");
              std::ostream::operator<<(pppMVar2,iter + 1);
              std::operator<<((ostream *)
                              &mf_sol.
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage," iterations.");
              std::operator<<((ostream *)
                              &mf_sol.
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage," resid, resid/");
              std::operator<<((ostream *)
                              &mf_sol.
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)&norm_name);
              std::operator<<((ostream *)
                              &mf_sol.
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage," = ");
              pPVar11 = Print::operator<<((Print *)&mf_sol,x);
              std::operator<<((ostream *)&pPVar11->ss,", ");
              std::ostream::_M_insert<double>(*x / dVar20);
              std::operator<<((ostream *)&pPVar11->ss,"\n");
              Print::~Print((Print *)&mf_sol);
            }
            Abort_host("MLMG failing so lets stop here");
          }
          goto LAB_004e23ab;
        }
        if (0 < this->verbose) {
          poVar9 = OutStream();
          Print::Print((Print *)&mf_sol,poVar9);
          pppMVar2 = &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::operator<<((ostream *)pppMVar2,"MLMG: Final Iter. ");
          std::ostream::operator<<(pppMVar2,iter + 1);
          std::operator<<((ostream *)pppMVar2," resid, resid/");
          std::operator<<((ostream *)pppMVar2,(string *)&norm_name);
          std::operator<<((ostream *)pppMVar2," = ");
          pPVar11 = Print::operator<<((Print *)&mf_sol,x);
          std::operator<<((ostream *)&pPVar11->ss,", ");
          std::ostream::_M_insert<double>(*x / dVar20);
          std::operator<<((ostream *)&pPVar11->ss,"\n");
          Print::~Print((Print *)&mf_sol);
        }
        goto LAB_004e2564;
      }
LAB_004e23ab:
    }
    if (this->do_fixed_number_of_iters == 0) {
      if (0 < this->verbose) {
        poVar9 = OutStream();
        Print::Print((Print *)&mf_sol,poVar9);
        std::operator<<((ostream *)
                        &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        "MLMG: Failed to converge after ");
        pPVar11 = Print::operator<<((Print *)&mf_sol,&this->max_iters);
        poVar1 = &pPVar11->ss;
        std::operator<<((ostream *)poVar1," iterations.");
        std::operator<<((ostream *)poVar1," resid, resid/");
        std::operator<<((ostream *)poVar1,(string *)&norm_name);
        std::operator<<((ostream *)poVar1," = ");
        pPVar11 = Print::operator<<(pPVar11,x);
        std::operator<<((ostream *)&pPVar11->ss,", ");
        std::ostream::_M_insert<double>(*x / dVar20);
        std::operator<<((ostream *)&pPVar11->ss,"\n");
        Print::~Print((Print *)&mf_sol);
      }
      Abort_host("MLMG failed");
    }
LAB_004e2564:
    dVar20 = second();
    (this->timer).super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
         = dVar20 - dVar18;
  }
  else {
    this->m_final_resnorm0 = resnorm0;
    if (0 < this->verbose) {
      poVar9 = OutStream();
      Print::Print((Print *)&mf_sol,poVar9);
      std::operator<<((ostream *)
                      &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      "MLMG: No iterations needed\n");
      Print::~Print((Print *)&mf_sol);
    }
  }
  bVar6 = this->final_fill_bc != 0;
  local_248 = (uint)bVar6;
  fine_norminf = (Real)(ulong)CONCAT14(bVar6,local_248);
  uVar12 = (ulong)(uint)(this->linop->info).hidden_direction;
  if (uVar12 < 3) {
    *(undefined4 *)((long)&fine_norminf + uVar12 * 4) = 0;
  }
  lVar14 = 0;
  for (lVar13 = 0; lVar13 < this->namrlevs; lVar13 = lVar13 + 1) {
    if ((this->sol_is_alias).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar13] == 0) {
      (*this->linop->_vptr_MLLinOp[0x2c])
                (this->linop,
                 (long)&(((local_240->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar14,(long)&(((this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl
                                 .super__Vector_impl_data._M_start)->m_ptr)._M_t.
                               super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                               .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                               _M_head_impl + lVar14,&fine_norminf);
    }
    lVar14 = lVar14 + 8;
  }
  dVar20 = second();
  *(this->timer).super_vector<double,_std::allocator<double>_>.
   super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       dVar20 - dVar17;
  if ((0 < this->verbose) && (*(int *)(DAT_006e0650 + -0x3c) == 0)) {
    poVar9 = OutStream();
    AllPrint::AllPrint((AllPrint *)&mf_sol,poVar9);
    std::operator<<((ostream *)
                    &mf_sol.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,"MLMG: Timers: Solve = ");
    pPVar11 = Print::operator<<((Print *)&mf_sol,
                                (this->timer).super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
    std::operator<<((ostream *)&pPVar11->ss," Iter = ");
    pPVar11 = Print::operator<<(pPVar11,(this->timer).super_vector<double,_std::allocator<double>_>.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + 1);
    std::operator<<((ostream *)&pPVar11->ss," Bottom = ");
    pPVar11 = Print::operator<<(pPVar11,(this->timer).super_vector<double,_std::allocator<double>_>.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + 2);
    std::operator<<((ostream *)&pPVar11->ss,"\n");
    Print::~Print((Print *)&mf_sol);
  }
  this->solve_called = this->solve_called + 1;
  local_240 = (Vector<amrex::Any,_std::allocator<amrex::Any>_> *)this->m_final_resnorm0;
  std::__cxx11::string::~string((string *)&norm_name);
  return (Real)local_240;
}

Assistant:

Real
MLMG::solve (Vector<Any>& a_sol, const Vector<Any>& a_rhs,
             Real a_tol_rel, Real a_tol_abs, const char* checkpoint_file)
{
    BL_PROFILE("MLMG::solve()");

    if (checkpoint_file != nullptr) {
        if (a_sol[0].is<MultiFab>()) {
            Vector<MultiFab*> mf_sol(namrlevs);
            Vector<MultiFab const*> mf_rhs(namrlevs);
            for (int lev = 0; lev < namrlevs; ++lev) {
                mf_sol[lev] = &(a_sol[lev].get<MultiFab>());
                mf_rhs[lev] = &(a_rhs[lev].get<MultiFab>());
            }
            checkPoint(mf_sol, mf_rhs, a_tol_rel, a_tol_abs, checkpoint_file);
        } else {
            amrex::Abort("MLMG::solve: checkpoint not supported for non-MultiFab type");
        }
    }

    if (bottom_solver == BottomSolver::Default) {
        bottom_solver = linop.getDefaultBottomSolver();
    }

#if defined(AMREX_USE_HYPRE) || defined(AMREX_USE_PETSC)
    if (bottom_solver == BottomSolver::hypre || bottom_solver == BottomSolver::petsc) {
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(a_sol[0].is<MultiFab>(),
                                         "Non-MultiFab type not supported for hypre and petsc");
        int mo = linop.getMaxOrder();
        if (a_sol[0].get<MultiFab>().hasEBFabFactory()) {
            linop.setMaxOrder(2);
        } else {
            linop.setMaxOrder(std::min(3,mo));  // maxorder = 4 not supported
        }
    }
#endif

    bool is_nsolve = linop.m_parent;

    auto solve_start_time = amrex::second();

    Real& composite_norminf = m_final_resnorm0;

    m_niters_cg.clear();
    m_iter_fine_resnorm0.clear();

    prepareForSolve(a_sol, a_rhs);

    computeMLResidual(finest_amr_lev);

    bool local = true;
    Real resnorm0 = MLResNormInf(finest_amr_lev, local);
    Real rhsnorm0 = MLRhsNormInf(local);
    if (!is_nsolve) {
        ParallelAllReduce::Max<Real>({resnorm0, rhsnorm0}, ParallelContext::CommunicatorSub());

        if (verbose >= 1)
        {
            amrex::Print() << "MLMG: Initial rhs               = " << rhsnorm0 << "\n"
                           << "MLMG: Initial residual (resid0) = " << resnorm0 << "\n";
        }
    }

    m_init_resnorm0 = resnorm0;
    m_rhsnorm0 = rhsnorm0;

    Real max_norm;
    std::string norm_name;
    if (always_use_bnorm || rhsnorm0 >= resnorm0) {
        norm_name = "bnorm";
        max_norm = rhsnorm0;
    } else {
        norm_name = "resid0";
        max_norm = resnorm0;
    }
    const Real res_target = std::max(a_tol_abs, std::max(a_tol_rel,Real(1.e-16))*max_norm);

    if (!is_nsolve && resnorm0 <= res_target) {
        composite_norminf = resnorm0;
        if (verbose >= 1) {
            amrex::Print() << "MLMG: No iterations needed\n";
        }
    } else {
        auto iter_start_time = amrex::second();
        bool converged = false;

        const int niters = do_fixed_number_of_iters ? do_fixed_number_of_iters : max_iters;
        for (int iter = 0; iter < niters; ++iter)
        {
            oneIter(iter);

            converged = false;

            // Test convergence on the fine amr level
            computeResidual(finest_amr_lev);

            if (is_nsolve) continue;

            Real fine_norminf = ResNormInf(finest_amr_lev);
            m_iter_fine_resnorm0.push_back(fine_norminf);
            composite_norminf = fine_norminf;
            if (verbose >= 2) {
                amrex::Print() << "MLMG: Iteration " << std::setw(3) << iter+1 << " Fine resid/"
                               << norm_name << " = " << fine_norminf/max_norm << "\n";
            }
            bool fine_converged = (fine_norminf <= res_target);

            if (namrlevs == 1 && fine_converged) {
                converged = true;
            } else if (fine_converged) {
                // finest level is converged, but we still need to test the coarse levels
                computeMLResidual(finest_amr_lev-1);
                Real crse_norminf = MLResNormInf(finest_amr_lev-1);
                if (verbose >= 2) {
                    amrex::Print() << "MLMG: Iteration " << std::setw(3) << iter+1
                                   << " Crse resid/" << norm_name << " = "
                                   << crse_norminf/max_norm << "\n";
                }
                converged = (crse_norminf <= res_target);
                composite_norminf = std::max(fine_norminf, crse_norminf);
            } else {
                converged = false;
            }

            if (converged) {
                if (verbose >= 1) {
                    amrex::Print() << "MLMG: Final Iter. " << iter+1
                                   << " resid, resid/" << norm_name << " = "
                                   << composite_norminf << ", "
                                   << composite_norminf/max_norm << "\n";
                }
                break;
            } else {
              if (composite_norminf > Real(1.e20)*max_norm)
              {
                  if (verbose > 0) {
                      amrex::Print() << "MLMG: Failing to converge after " << iter+1 << " iterations."
                                     << " resid, resid/" << norm_name << " = "
                                     << composite_norminf << ", "
                                     << composite_norminf/max_norm << "\n";
                  }
                  amrex::Abort("MLMG failing so lets stop here");
              }
            }
        }

        if (!converged && do_fixed_number_of_iters == 0) {
            if (verbose > 0) {
                amrex::Print() << "MLMG: Failed to converge after " << max_iters << " iterations."
                               << " resid, resid/" << norm_name << " = "
                               << composite_norminf << ", "
                               << composite_norminf/max_norm << "\n";
            }
            amrex::Abort("MLMG failed");
        }
        timer[iter_time] = amrex::second() - iter_start_time;
    }

    IntVect ng_back = final_fill_bc ? IntVect(1) : IntVect(0);
    if (linop.hasHiddenDimension()) {
        ng_back[linop.hiddenDirection()] = 0;
    }
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (!sol_is_alias[alev]) {
            linop.AnyCopy(a_sol[alev], sol[alev], ng_back);
        }
    }

    timer[solve_time] = amrex::second() - solve_start_time;
    if (verbose >= 1) {
        ParallelReduce::Max<double>(timer.data(), timer.size(), 0,
                                    ParallelContext::CommunicatorSub());
        if (ParallelContext::MyProcSub() == 0)
        {
            amrex::AllPrint() << "MLMG: Timers: Solve = " << timer[solve_time]
                              << " Iter = " << timer[iter_time]
                              << " Bottom = " << timer[bottom_time] << "\n";
        }
    }

    ++solve_called;

    return composite_norminf;
}